

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  unsigned_long_long uVar5;
  BYTE *pBVar6;
  ushort uVar7;
  int iVar8;
  U32 UVar9;
  U32 UVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  long lVar15;
  BYTE *pBVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ZSTD_CCtx_params *pZVar20;
  BYTE *pBVar21;
  short *psVar22;
  size_t sVar23;
  undefined8 *puVar24;
  BYTE *ip;
  size_t sVar25;
  uint uVar26;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  int iVar14;
  
  if (cctx->stage == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  if (cctx->stage == ZSTDcs_init && frame != 0) {
    uVar5 = cctx->pledgedSrcSizePlusOne;
    UVar10 = cctx->dictID;
    pZVar20 = &cctx->appliedParams;
    puVar24 = (undefined8 *)&stack0xffffffffffffff08;
    for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
      *puVar24 = *(undefined8 *)pZVar20;
      pZVar20 = (ZSTD_CCtx_params *)&(pZVar20->cParams).chainLog;
      puVar24 = puVar24 + 1;
    }
    sVar11 = ZSTD_writeFrameHeader(dst,dstCapacity,in_stack_ffffffffffffff08,uVar5 - 1,UVar10);
    if (0xffffffffffffff88 < sVar11) {
      return sVar11;
    }
    dstCapacity = dstCapacity - sVar11;
    dst = (void *)((long)dst + sVar11);
    cctx->stage = ZSTDcs_ongoing;
  }
  else {
    sVar11 = 0;
  }
  sVar23 = sVar11;
  if (srcSize != 0) {
    pBVar6 = (cctx->blockState).matchState.window.nextSrc;
    if (pBVar6 == (BYTE *)src) {
      pBVar21 = (cctx->blockState).matchState.window.dictBase;
      uVar13 = (cctx->blockState).matchState.window.lowLimit;
      uVar17 = (ulong)(cctx->blockState).matchState.window.dictLimit;
    }
    else {
      pBVar21 = (cctx->blockState).matchState.window.base;
      uVar17 = (long)pBVar6 - (long)pBVar21;
      uVar13 = (cctx->blockState).matchState.window.dictLimit;
      (cctx->blockState).matchState.window.lowLimit = uVar13;
      uVar26 = (uint)uVar17;
      (cctx->blockState).matchState.window.dictLimit = uVar26;
      (cctx->blockState).matchState.window.dictBase = pBVar21;
      (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar17);
      if (uVar26 - uVar13 < 8) {
        (cctx->blockState).matchState.window.lowLimit = uVar26;
        uVar13 = uVar26;
      }
    }
    pBVar2 = (BYTE *)((long)src + srcSize);
    (cctx->blockState).matchState.window.nextSrc = pBVar2;
    uVar26 = (uint)uVar17;
    if ((pBVar21 + uVar13 < pBVar2) && (src < pBVar21 + (uVar17 & 0xffffffff))) {
      uVar13 = (uint)((long)pBVar2 - (long)pBVar21);
      if ((long)(uVar17 & 0xffffffff) < (long)pBVar2 - (long)pBVar21) {
        uVar13 = uVar26;
      }
      (cctx->blockState).matchState.window.lowLimit = uVar13;
    }
    if (pBVar6 != (BYTE *)src) {
      (cctx->blockState).matchState.nextToUpdate = uVar26;
    }
    if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
      pBVar6 = (cctx->ldmState).window.nextSrc;
      if (pBVar6 == (BYTE *)src) {
        pBVar16 = (cctx->ldmState).window.dictBase;
        uVar17 = (ulong)(cctx->ldmState).window.dictLimit;
        UVar10 = (cctx->ldmState).window.lowLimit;
      }
      else {
        pBVar16 = (cctx->ldmState).window.base;
        uVar17 = (long)pBVar6 - (long)pBVar16;
        UVar10 = (cctx->ldmState).window.dictLimit;
        (cctx->ldmState).window.lowLimit = UVar10;
        UVar9 = (U32)uVar17;
        (cctx->ldmState).window.dictLimit = UVar9;
        (cctx->ldmState).window.dictBase = pBVar16;
        (cctx->ldmState).window.base = (BYTE *)((long)src - uVar17);
        if (UVar9 - UVar10 < 8) {
          (cctx->ldmState).window.lowLimit = UVar9;
          UVar10 = UVar9;
        }
      }
      (cctx->ldmState).window.nextSrc = pBVar2;
      if ((pBVar16 + UVar10 < pBVar2) && (src < pBVar16 + (uVar17 & 0xffffffff))) {
        UVar10 = (U32)((long)pBVar2 - (long)pBVar16);
        if ((long)(uVar17 & 0xffffffff) < (long)pBVar2 - (long)pBVar16) {
          UVar10 = (U32)uVar17;
        }
        (cctx->ldmState).window.lowLimit = UVar10;
      }
    }
    if (frame == 0) {
      pBVar6 = (cctx->blockState).matchState.window.base;
      iVar19 = (int)pBVar6;
      if (0xe0000000 < (uint)((int)pBVar2 - iVar19)) {
        uVar18 = (int)src - iVar19;
        uVar18 = (uVar18 + (-1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f))) -
                 (~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                           (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) & 0x1fU)) & uVar18)
        ;
        (cctx->blockState).matchState.window.base = pBVar6 + uVar18;
        (cctx->blockState).matchState.window.dictBase = pBVar21 + uVar18;
        (cctx->blockState).matchState.window.lowLimit = uVar13 - uVar18;
        (cctx->blockState).matchState.window.dictLimit = uVar26 - uVar18;
        ZSTD_reduceIndex(cctx,uVar18);
        uVar13 = (cctx->blockState).matchState.nextToUpdate;
        UVar10 = uVar13 - uVar18;
        if (uVar13 < uVar18) {
          UVar10 = 0;
        }
        (cctx->blockState).matchState.nextToUpdate = UVar10;
        (cctx->blockState).matchState.loadedDictEnd = 0;
        (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
      }
      sVar23 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize);
    }
    else {
      iVar19 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
      sVar23 = cctx->blockSize;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XXH64_update(&cctx->xxhState,src,srcSize);
      }
      psVar22 = (short *)dst;
      sVar25 = srcSize;
      do {
        uVar7 = (ushort)lastFrameChunk & 1;
        if (sVar23 < sVar25) {
          uVar7 = 0;
        }
        if (dstCapacity < 6) {
          return 0xffffffffffffffba;
        }
        if (sVar25 < sVar23) {
          sVar23 = sVar25;
        }
        pBVar6 = (cctx->blockState).matchState.window.base;
        iVar8 = (int)pBVar6;
        iVar14 = (int)(void *)((long)src + sVar23);
        uVar13 = iVar14 - iVar8;
        if (uVar13 < 0xe0000001) {
          UVar10 = (cctx->blockState).matchState.loadedDictEnd;
        }
        else {
          uVar26 = (int)src - iVar8;
          uVar26 = uVar26 - ((~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                                       (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) & 0x1fU
                                      )) & uVar26) + iVar19);
          (cctx->blockState).matchState.window.base = pBVar6 + uVar26;
          ppBVar1 = &(cctx->blockState).matchState.window.dictBase;
          *ppBVar1 = *ppBVar1 + uVar26;
          uVar3 = (cctx->blockState).matchState.window.dictLimit;
          uVar4 = (cctx->blockState).matchState.window.lowLimit;
          (cctx->blockState).matchState.window.dictLimit = uVar3 - uVar26;
          (cctx->blockState).matchState.window.lowLimit = uVar4 - uVar26;
          ZSTD_reduceIndex(cctx,uVar26);
          uVar13 = (cctx->blockState).matchState.nextToUpdate;
          UVar10 = 0;
          UVar9 = uVar13 - uVar26;
          if (uVar13 < uVar26) {
            UVar9 = 0;
          }
          (cctx->blockState).matchState.nextToUpdate = UVar9;
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          uVar13 = iVar14 - *(int *)&(cctx->blockState).matchState.window.base;
        }
        uVar26 = (cctx->blockState).matchState.window.lowLimit;
        if (UVar10 + iVar19 < uVar13) {
          uVar13 = uVar13 - iVar19;
          if (uVar26 < uVar13) {
            (cctx->blockState).matchState.window.lowLimit = uVar13;
            uVar26 = uVar13;
          }
          if ((cctx->blockState).matchState.window.dictLimit < uVar26) {
            (cctx->blockState).matchState.window.dictLimit = uVar26;
          }
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        }
        if ((cctx->blockState).matchState.nextToUpdate < uVar26) {
          (cctx->blockState).matchState.nextToUpdate = uVar26;
        }
        sVar12 = ZSTD_compressBlock_internal
                           (cctx,(void *)((long)psVar22 + 3),dstCapacity - 3,src,sVar23);
        if (0xffffffffffffff88 < sVar12) {
          return sVar12;
        }
        if (sVar12 == 0) {
          uVar17 = sVar23 + 3;
          if (dstCapacity < uVar17) {
            return 0xffffffffffffffba;
          }
          *psVar22 = uVar7 + (short)sVar23 * 8;
          *(char *)(psVar22 + 1) = (char)(sVar23 >> 0xd);
          memcpy((void *)((long)psVar22 + 3),src,sVar23);
          if (0xffffffffffffff88 < uVar17) {
            return uVar17;
          }
        }
        else {
          *psVar22 = uVar7 + (short)sVar12 * 8 + 4;
          *(char *)(psVar22 + 1) = (char)(sVar12 >> 0xd);
          uVar17 = sVar12 + 3;
        }
        psVar22 = (short *)((long)psVar22 + uVar17);
        dstCapacity = dstCapacity - uVar17;
        sVar25 = sVar25 - sVar23;
        src = (void *)((long)src + sVar23);
      } while (sVar25 != 0);
      if ((lastFrameChunk != 0) && (dst < psVar22)) {
        cctx->stage = ZSTDcs_ending;
      }
      sVar23 = (long)psVar22 - (long)dst;
    }
    if (sVar23 < 0xffffffffffffff89) {
      uVar5 = cctx->consumedSrcSize;
      cctx->consumedSrcSize = uVar5 + srcSize;
      sVar23 = sVar23 + sVar11;
      cctx->producedCSize = cctx->producedCSize + sVar23;
      sVar11 = 0xffffffffffffffb8;
      if (uVar5 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
        sVar11 = sVar23;
      }
      if (cctx->pledgedSrcSizePlusOne != 0) {
        sVar23 = sVar11;
      }
    }
  }
  return sVar23;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        if (ZSTD_window_needOverflowCorrection(ms->window, (const char*)src + srcSize)) {
            U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
            U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, 1 << cctx->appliedParams.cParams.windowLog, src);
            ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
            ZSTD_reduceIndex(cctx, correction);
            if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
            else ms->nextToUpdate -= correction;
            ms->loadedDictEnd = 0;
            ms->dictMatchState = NULL;
        }
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}